

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printRotImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  char *pcVar3;
  char *pcVar4;
  MCOperand *op;
  int64_t iVar5;
  int iVar6;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar5 = MCOperand_getImm(op);
  iVar6 = (int)iVar5;
  if (iVar6 != 0) {
    SStream_concat0(O,", ror #");
    pcVar3 = anon_var_dwarf_7081f;
    if (iVar6 == 2) {
      pcVar3 = anon_var_dwarf_7082b;
    }
    pcVar4 = anon_var_dwarf_70753;
    if (iVar6 != 3) {
      pcVar4 = pcVar3;
    }
    SStream_concat0(O,pcVar4 + 0x15);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x12;
      puVar1[0] = '\x04';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x16) = iVar6 << 3;
    }
  }
  return;
}

Assistant:

static void printRotImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (Imm == 0)
		return;
	SStream_concat0(O, ", ror #");
	switch (Imm) {
		default: //assert (0 && "illegal ror immediate!");
		case 1: SStream_concat0(O, "8"); break;
		case 2: SStream_concat0(O, "16"); break;
		case 3: SStream_concat0(O, "24"); break;
	}
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ROR;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Imm * 8;
	}
}